

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connection.cpp
# Opt level: O3

unique_ptr<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>_> __thiscall
KDIS::NETWORK::Connection::GetNextPDU(Connection *this,KString *SenderIp)

{
  KDataStream *this_00;
  pointer pcVar1;
  long *plVar2;
  char cVar3;
  KUINT16 KVar4;
  KUINT16 KVar5;
  int iVar6;
  string *in_RDX;
  pointer pcVar7;
  Header6 *this_01;
  pointer *__ptr;
  KOCTET Buffer [8192];
  KOCTET local_2038 [8200];
  
  this_00 = (KDataStream *)(SenderIp + 4);
  KVar4 = KDataStream::GetBufferSize(this_00);
  if (KVar4 == 0) {
    iVar6 = (**(code **)((SenderIp->_M_dataplus)._M_p + 0x80))
                      (SenderIp,local_2038,0x2000,&SenderIp[5]._M_string_length);
    if (iVar6 != 0) {
      pcVar1 = (pointer)SenderIp[3]._M_string_length;
      for (pcVar7 = SenderIp[3]._M_dataplus._M_p; pcVar7 != pcVar1; pcVar7 = pcVar7 + 8) {
        cVar3 = (**(code **)(**(long **)pcVar7 + 0x10))
                          (*(long **)pcVar7,local_2038,iVar6,&SenderIp[5]._M_string_length);
        if (cVar3 == '\0') goto LAB_001292fd;
      }
      KDataStream::Clear(this_00);
      KDataStream::CopyFromBuffer(this_00,local_2038,(KUINT16)iVar6,Big_Endian);
    }
  }
  KVar4 = KDataStream::GetBufferSize(this_00);
  if (KVar4 != 0) {
    if (in_RDX != (string *)0x0) {
      std::__cxx11::string::_M_assign(in_RDX);
    }
    KVar4 = KDataStream::GetCurrentWritePosition(this_00);
    plVar2 = *(long **)((long)&SenderIp[3].field_2 + 8);
    (**(code **)(*plVar2 + 8))(this,plVar2,this_00);
    this_01 = (Header6 *)this->_vptr_Connection;
    if (this_01 != (Header6 *)0x0) {
      pcVar7 = SenderIp[3]._M_dataplus._M_p;
      pcVar1 = (pointer)SenderIp[3]._M_string_length;
      if (pcVar7 != pcVar1) {
        do {
          (**(code **)(**(long **)pcVar7 + 0x18))(*(long **)pcVar7,this->_vptr_Connection);
          pcVar7 = pcVar7 + 8;
        } while (pcVar7 != pcVar1);
        this_01 = (Header6 *)this->_vptr_Connection;
      }
      KVar5 = PDU::Header6::GetPDULength(this_01);
      KDataStream::SetCurrentWritePosition(this_00,KVar5 + KVar4);
      return (__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>
              )(__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>
                )this;
    }
    KDataStream::Clear(this_00);
    if (this->_vptr_Connection != (_func_int **)0x0) {
      (**(code **)(*this->_vptr_Connection + 8))();
    }
  }
LAB_001292fd:
  this->_vptr_Connection = (_func_int **)0x0;
  return (__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>)
         (__uniq_ptr_data<KDIS::PDU::Header7,_std::default_delete<KDIS::PDU::Header7>,_true,_true>)
         this;
}

Assistant:

unique_ptr<Header> Connection::GetNextPDU(KString *SenderIp /* = 0 */ ) noexcept(false)
{
    // Are we currently dealing with a PDU Bundle, if so then dont read any new data.
    if( m_stream.GetBufferSize() == 0 )
    {
        // Get some new data from the network
        // Create a buffer to store network data
        KOCTET Buffer[MAX_PDU_SIZE];
        KINT32 iSz = Receive( Buffer, MAX_PDU_SIZE, &m_sLastIP );

        if( iSz )
        {
            // Fire the first event, this event can also be used to inform us if we should stop
            vector<ConnectionSubscriber*>::iterator itr = m_vpSubscribers.begin();
            vector<ConnectionSubscriber*>::iterator itrEnd = m_vpSubscribers.end();
            for( ; itr != itrEnd; ++itr )
            {
                if( !( *itr )->OnDataReceived( Buffer, iSz, m_sLastIP ) )
                {
                    // We should quit
                    return unique_ptr<Header>();
                }
            }

            // Create a new data stream
            m_stream.Clear();
            m_stream.CopyFromBuffer( Buffer, iSz );
        }
    }

    // Now process the stream
    if( m_stream.GetBufferSize() > 0 )
    {
        // Do they want the IP address returned?
        if( SenderIp )
        {
            *SenderIp = m_sLastIP;
        }

        // Get the current write position
        KUINT16 currentPos = m_stream.GetCurrentWritePosition();

        try
        {
            // Get the next/only PDU from the stream
            unique_ptr<Header> pdu = m_pPduFact->Decode( m_stream );

            // If the PDU was decoded successfully then fire the next event
            if( pdu.get() )
            {
                vector<ConnectionSubscriber*>::iterator itr = m_vpSubscribers.begin();
                vector<ConnectionSubscriber*>::iterator itrEnd = m_vpSubscribers.end();
                for( ; itr != itrEnd; ++itr )
                {
                    ( *itr )->OnPDUReceived( pdu.get() );
                }

                // Set the write pos for the next pdu. We do this here as its possible that when the PDU was decoded that some data may
				// have been left un-decoded so to be extra safe we use the reported pdu size and not the current stream.
                m_stream.SetCurrentWritePosition( currentPos + pdu->GetPDULength() );

                // Now return the decoded pdu
                return pdu;
            }
            else
            {
                // If a PDU could not be decoded in the PDU bundle, then we need to throw
                // out the whole stream. There is no way to know where the next PDU might start
                // in the data stream.
                m_stream.Clear();
            }
        }
        catch( const exception & e )
        {
            // Something went wrong, the stream is likely corrupted now so wipe it or we will have issues in the next GetNextPDU call.
            m_stream.Clear();
            throw;
        }
    }

    return unique_ptr<Header>(); // No data so Null ptr
}